

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

FCell __thiscall cppforth::Forth::getDataFCell32(Forth *this,CAddr pointer)

{
  Char CVar1;
  long lVar2;
  float value1;
  float local_1c;
  
  local_1c = 0.0;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    CVar1 = dataSpaceAt(this,pointer + (int)lVar2);
    *(Char *)((long)&local_1c + lVar2) = CVar1;
  }
  return (double)local_1c;
}

Assistant:

FCell getDataFCell32(CAddr pointer){
			float value1{ 0 };
			for (Cell i = 0; i < sizeof(value1); ++i){
				static_cast<unsigned char*>(static_cast<void*>(&value1))[i] = dataSpaceAt(pointer + i);
			}
			return value1;
		}